

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

void QCoreApplication::exit(int __status)

{
  QCoreApplicationPrivate *pQVar1;
  Type this;
  qsizetype qVar2;
  const_reference ppQVar3;
  QEventLoop *eventLoop;
  qsizetype i;
  QThreadData *data;
  QCoreApplicationPrivate *d;
  long i_00;
  QList<QEventLoop_*> *in_stack_ffffffffffffffd0;
  long local_28;
  
  if (self != (QCoreApplication *)0x0) {
    pQVar1 = d_func((QCoreApplication *)0x33f6bd);
    if ((pQVar1->aboutToQuitEmitted & 1U) == 0) {
      aboutToQuit(self);
      pQVar1->aboutToQuitEmitted = true;
    }
    this = QBasicAtomicPointer<QThreadData>::loadRelaxed
                     ((QBasicAtomicPointer<QThreadData> *)0x33f6f9);
    this->quitNow = true;
    local_28 = 0;
    while (i_00 = local_28, qVar2 = QList<QEventLoop_*>::size((QList<QEventLoop_*> *)this),
          i_00 < qVar2) {
      ppQVar3 = QList<QEventLoop_*>::at(in_stack_ffffffffffffffd0,i_00);
      in_stack_ffffffffffffffd0 = (QList<QEventLoop_*> *)*ppQVar3;
      QEventLoop::exit((QEventLoop *)in_stack_ffffffffffffffd0,__status);
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

void QCoreApplication::exit(int returnCode)
{
    if (!self)
        return;
    QCoreApplicationPrivate *d = self->d_func();
    if (!d->aboutToQuitEmitted) {
        emit self->aboutToQuit(QCoreApplication::QPrivateSignal());
        d->aboutToQuitEmitted = true;
    }
    QThreadData *data = d->threadData.loadRelaxed();
    data->quitNow = true;
    for (qsizetype i = 0; i < data->eventLoops.size(); ++i) {
        QEventLoop *eventLoop = data->eventLoops.at(i);
        eventLoop->exit(returnCode);
    }
}